

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processestimator.cxx
# Opt level: O1

void __thiscall ProcessEstimator::~ProcessEstimator(ProcessEstimator *this)

{
  ulong uVar1;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ProcessEstimator_0015ec70;
  if (this->aSample != (double *)0x0) {
    operator_delete__(this->aSample);
  }
  if (this->aOne != (double *)0x0) {
    operator_delete__(this->aOne);
  }
  if (this->aTwo != (double *)0x0) {
    operator_delete__(this->aTwo);
  }
  if ((this->aThree != (double *)0x0) && (this->aTwo != (double *)0x0)) {
    operator_delete__(this->aTwo);
  }
  if (this->aDist != (double **)0x0) {
    if (this->nLength != 0) {
      uVar1 = 0;
      do {
        if (this->aDist[uVar1] != (double *)0x0) {
          operator_delete__(this->aDist[uVar1]);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->nLength);
    }
    if (this->aDist != (double **)0x0) {
      operator_delete(this->aDist,8);
    }
  }
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

ProcessEstimator::~ProcessEstimator()
{
    delete[] aSample;
	if(aOne) delete[] aOne;
	if(aTwo) delete[] aTwo;
	if(aThree) delete[] aTwo;
	if(aDist) {
		for(uint i=0; i<nLength; i++)
			delete[] aDist[i];
		delete aDist;
	}
}